

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
          (QMovableArrayOps<QCss::StyleRule> *this,qsizetype i,StyleRule *args)

{
  qsizetype *pqVar1;
  StyleRule **ppSVar2;
  StyleRule *pSVar3;
  int iVar4;
  Data *pDVar5;
  StyleRule *pSVar6;
  Data *pDVar7;
  Data *pDVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QArrayDataPointer<QCss::Selector> local_70;
  QArrayDataPointer<QCss::Declaration> local_58;
  int iStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QGenericArrayOps<QCss::StyleRule>).super_QArrayDataPointer<QCss::StyleRule>.
           d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00387081:
    local_70.d = (args->selectors).d.d;
    local_70.ptr = (args->selectors).d.ptr;
    local_70.size = (args->selectors).d.size;
    if (local_70.d != (Data *)0x0) {
      LOCK();
      ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.d = (args->declarations).d.d;
    local_58.ptr = (args->declarations).d.ptr;
    local_58.size = (args->declarations).d.size;
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    iVar4 = args->order;
    _iStack_40 = CONCAT44(0xaaaaaaaa,iVar4);
    bVar9 = (this->super_QGenericArrayOps<QCss::StyleRule>).super_QArrayDataPointer<QCss::StyleRule>
            .size != 0;
    QArrayDataPointer<QCss::StyleRule>::detachAndGrow
              ((QArrayDataPointer<QCss::StyleRule> *)this,(uint)(i == 0 && bVar9),1,
               (StyleRule **)0x0,(QArrayDataPointer<QCss::StyleRule> *)0x0);
    pSVar6 = (this->super_QGenericArrayOps<QCss::StyleRule>).
             super_QArrayDataPointer<QCss::StyleRule>.ptr;
    if (i == 0 && bVar9) {
      pSVar6[-1].selectors.d.d = local_70.d;
      pSVar6[-1].selectors.d.ptr = local_70.ptr;
      pSVar6[-1].selectors.d.size = local_70.size;
      pSVar6[-1].declarations.d.d = local_58.d;
      pSVar6[-1].declarations.d.ptr = local_58.ptr;
      pSVar6[-1].declarations.d.size = local_58.size;
      pSVar6[-1].order = iVar4;
      (this->super_QGenericArrayOps<QCss::StyleRule>).super_QArrayDataPointer<QCss::StyleRule>.ptr =
           pSVar6 + -1;
    }
    else {
      pSVar3 = pSVar6 + i;
      memmove(pSVar3 + 1,pSVar6 + i,
              ((this->super_QGenericArrayOps<QCss::StyleRule>).
               super_QArrayDataPointer<QCss::StyleRule>.size - i) * 0x38);
      (pSVar3->selectors).d.d = local_70.d;
      (pSVar3->selectors).d.ptr = local_70.ptr;
      (pSVar3->selectors).d.size = local_70.size;
      (pSVar3->declarations).d.d = local_58.d;
      (pSVar3->declarations).d.ptr = local_58.ptr;
      (pSVar3->declarations).d.size = local_58.size;
      pSVar3->order = iVar4;
    }
    local_58.size = 0;
    local_58.ptr = (Declaration *)0x0;
    local_58.d = (Data *)0x0;
    local_70.size = 0;
    local_70.ptr = (Selector *)0x0;
    local_70.d = (Data *)0x0;
    pqVar1 = &(this->super_QGenericArrayOps<QCss::StyleRule>).
              super_QArrayDataPointer<QCss::StyleRule>.size;
    *pqVar1 = *pqVar1 + 1;
    QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<QCss::Selector>::~QArrayDataPointer(&local_70);
  }
  else {
    if (((this->super_QGenericArrayOps<QCss::StyleRule>).super_QArrayDataPointer<QCss::StyleRule>.
         size == i) &&
       (pSVar6 = (this->super_QGenericArrayOps<QCss::StyleRule>).
                 super_QArrayDataPointer<QCss::StyleRule>.ptr,
       (pDVar5->super_QArrayData).alloc - i !=
       ((long)((long)pSVar6 -
              ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       0x6db6db6db6db6db7)) {
      pDVar7 = (args->selectors).d.d;
      pSVar6[i].selectors.d.d = pDVar7;
      pSVar6[i].selectors.d.ptr = (args->selectors).d.ptr;
      pSVar6[i].selectors.d.size = (args->selectors).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar8 = (args->declarations).d.d;
      pSVar6[i].declarations.d.d = pDVar8;
      pSVar6[i].declarations.d.ptr = (args->declarations).d.ptr;
      pSVar6[i].declarations.d.size = (args->declarations).d.size;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pSVar6[i].order = args->order;
    }
    else {
      if ((i != 0) ||
         (pSVar6 = (this->super_QGenericArrayOps<QCss::StyleRule>).
                   super_QArrayDataPointer<QCss::StyleRule>.ptr,
         (StyleRule *)((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pSVar6)) goto LAB_00387081;
      pDVar7 = (args->selectors).d.d;
      pSVar6[-1].selectors.d.d = pDVar7;
      pSVar6[-1].selectors.d.ptr = (args->selectors).d.ptr;
      pSVar6[-1].selectors.d.size = (args->selectors).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar8 = (args->declarations).d.d;
      pSVar6[-1].declarations.d.d = pDVar8;
      pSVar6[-1].declarations.d.ptr = (args->declarations).d.ptr;
      pSVar6[-1].declarations.d.size = (args->declarations).d.size;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pSVar6[-1].order = args->order;
      ppSVar2 = &(this->super_QGenericArrayOps<QCss::StyleRule>).
                 super_QArrayDataPointer<QCss::StyleRule>.ptr;
      *ppSVar2 = *ppSVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QCss::StyleRule>).
              super_QArrayDataPointer<QCss::StyleRule>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }